

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O0

void yactfr::internal::buildBasicReadInstr<yactfr::internal::ReadFlSIntInstr>
               (StructureMemberType *memberType,DataType *dt,Proc *baseProc)

{
  shared_ptr<yactfr::internal::ReadFlSIntInstr> local_40;
  shared_ptr<yactfr::internal::Instr> local_30;
  Proc *local_20;
  Proc *baseProc_local;
  DataType *dt_local;
  StructureMemberType *memberType_local;
  
  local_20 = baseProc;
  baseProc_local = (Proc *)dt;
  dt_local = (DataType *)memberType;
  std::
  make_shared<yactfr::internal::ReadFlSIntInstr,yactfr::StructureMemberType_const*const&,yactfr::DataType_const&>
            ((StructureMemberType **)&local_40,(DataType *)&dt_local);
  std::shared_ptr<yactfr::internal::Instr>::shared_ptr<yactfr::internal::ReadFlSIntInstr,void>
            (&local_30,&local_40);
  Proc::pushBack(baseProc,&local_30);
  std::shared_ptr<yactfr::internal::Instr>::~shared_ptr(&local_30);
  std::shared_ptr<yactfr::internal::ReadFlSIntInstr>::~shared_ptr(&local_40);
  return;
}

Assistant:

void buildBasicReadInstr(const StructureMemberType * const memberType, const DataType& dt,
                         Proc& baseProc)
{
    baseProc.pushBack(std::make_shared<ReadInstrT>(memberType, dt));
}